

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Term.cpp
# Opt level: O3

string * __thiscall Kernel::Term::headToString_abi_cxx11_(string *__return_storage_ptr__,Term *this)

{
  pointer pcVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  Tuples *this_00;
  undefined8 *puVar6;
  TermList TVar7;
  TermList TVar8;
  long lVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  undefined8 *puVar11;
  Symbol *pSVar12;
  OperatorType *pOVar13;
  long *plVar14;
  uint uVar15;
  ulong *puVar16;
  size_type *psVar17;
  long *plVar18;
  uint *puVar19;
  uint i;
  uint extraout_EDX;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 uVar20;
  uint uVar21;
  uint *puVar22;
  _Alloc_hider _Var23;
  uint uVar24;
  ulong uVar25;
  string typesList;
  uint proj;
  string symbolsList;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  TermList lambdaExp;
  TermList binding;
  TermList binding_1;
  string local_1c0;
  string local_1a0;
  string local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  string local_140;
  string *local_120;
  string local_118;
  TermList local_f8;
  long local_f0;
  long local_e8;
  long lStack_e0;
  TermList local_d8;
  long local_d0;
  ulong local_c8;
  long lStack_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  string local_78;
  TermList local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  switch(this->_functor) {
  case 0xfffffff9:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    *(undefined4 *)&__return_storage_ptr__->field_2 = 0x74616d24;
    *(undefined4 *)((long)&__return_storage_ptr__->field_2 + 3) = 0x28686374;
    __return_storage_ptr__->_M_string_length = 7;
    (__return_storage_ptr__->field_2)._M_local_buf[7] = '\0';
    return __return_storage_ptr__;
  case 0xfffffffa:
    puVar22 = *(uint **)&this[-1]._weight;
    puVar6 = *(undefined8 **)&this[-1]._maxRedLen;
    local_f8._content = *(uint64_t *)&this[-1]._functor;
    local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
    local_180.field_2._M_allocated_capacity._0_2_ = 0x5b;
    local_180._M_string_length = 1;
    local_120 = __return_storage_ptr__;
    if (puVar22 != (uint *)0x0) {
      paVar10 = &local_1c0.field_2;
      bVar3 = true;
      do {
        uVar21 = (uint)in_RDX;
        if (!bVar3) {
          std::__cxx11::string::append((char *)&local_180);
          uVar21 = extraout_EDX;
        }
        uVar24 = *puVar22;
        puVar22 = *(uint **)(puVar22 + 2);
        variableToString_abi_cxx11_(&local_1a0,(Term *)(ulong)uVar24,uVar21);
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_1a0);
        puVar16 = puVar11 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar16) {
          local_1c0.field_2._M_allocated_capacity = *puVar16;
          local_1c0.field_2._8_8_ = puVar11[3];
          local_1c0._M_dataplus._M_p = (pointer)paVar10;
        }
        else {
          local_1c0.field_2._M_allocated_capacity = *puVar16;
          local_1c0._M_dataplus._M_p = (pointer)*puVar11;
        }
        local_1c0._M_string_length = puVar11[1];
        *puVar11 = puVar16;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_180,(ulong)local_1c0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._M_dataplus._M_p != paVar10) {
          operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
          operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
        }
        local_1a0._M_dataplus._M_p = (pointer)*puVar6;
        puVar6 = (undefined8 *)puVar6[1];
        TermList::toString_abi_cxx11_(&local_1c0,(TermList *)&local_1a0,false);
        std::__cxx11::string::_M_append((char *)&local_180,(ulong)local_1c0._M_dataplus._M_p);
        in_RDX = extraout_RDX;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._M_dataplus._M_p != paVar10) {
          operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
          in_RDX = extraout_RDX_00;
        }
        bVar3 = false;
      } while (puVar22 != (uint *)0x0);
    }
    std::__cxx11::string::append((char *)&local_180);
    std::operator+(&local_160,"(^",&local_180);
    __return_storage_ptr__ = local_120;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_160);
    paVar10 = &local_1a0.field_2;
    puVar16 = puVar6 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar16) {
      local_1a0.field_2._M_allocated_capacity = *puVar16;
      local_1a0.field_2._8_8_ = puVar6[3];
      local_1a0._M_dataplus._M_p = (pointer)paVar10;
    }
    else {
      local_1a0.field_2._M_allocated_capacity = *puVar16;
      local_1a0._M_dataplus._M_p = (pointer)*puVar6;
    }
    local_1a0._M_string_length = puVar6[1];
    *puVar6 = puVar16;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    TermList::toString_abi_cxx11_(&local_140,&local_f8,false);
    uVar20 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != paVar10) {
      uVar20 = local_1a0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar20 < local_140._M_string_length + local_1a0._M_string_length) {
      uVar20 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        uVar20 = local_140.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar20 < local_140._M_string_length + local_1a0._M_string_length)
      goto LAB_005bd334;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_140,0,(char *)0x0,(ulong)local_1a0._M_dataplus._M_p);
    }
    else {
LAB_005bd334:
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_1a0,(ulong)local_140._M_dataplus._M_p)
      ;
    }
    local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
    puVar16 = puVar6 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar16) {
      local_1c0.field_2._M_allocated_capacity = *puVar16;
      local_1c0.field_2._8_8_ = puVar6[3];
    }
    else {
      local_1c0.field_2._M_allocated_capacity = *puVar16;
      local_1c0._M_dataplus._M_p = (pointer)*puVar6;
    }
    local_1c0._M_string_length = puVar6[1];
    *puVar6 = puVar16;
    puVar6[1] = 0;
    *(undefined1 *)puVar16 = 0;
    plVar14 = (long *)std::__cxx11::string::append((char *)&local_1c0);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar17 = (size_type *)(plVar14 + 2);
    if ((size_type *)*plVar14 == psVar17) {
      lVar9 = plVar14[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar17;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar9;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar14;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar17;
    }
    __return_storage_ptr__->_M_string_length = plVar14[1];
    *plVar14 = (long)psVar17;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != paVar10) {
      operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
    }
    uVar20 = local_160.field_2._M_allocated_capacity;
    _Var23._M_p = local_160._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p == &local_160.field_2) goto LAB_005bdcff;
    goto LAB_005bdced;
  case 0xfffffffb:
    puVar22 = *(uint **)&this[-1]._weight;
    local_d8._content = *(uint64_t *)&this[-1]._maxRedLen;
    local_120 = __return_storage_ptr__;
    pOVar13 = Signature::Symbol::fnType((DAT_00b521b0->_funs)._stack[this[-1]._functor]);
    local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
    uVar24 = 0;
    local_180._M_string_length = 0;
    local_180.field_2._M_allocated_capacity =
         local_180.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
    local_1c0._M_string_length = 0;
    local_1c0.field_2._M_allocated_capacity =
         local_1c0.field_2._M_allocated_capacity & 0xffffffffffffff00;
    uVar21 = 0;
    while( true ) {
      uVar4 = 0;
      if (puVar22 != (uint *)0x0) {
        uVar4 = 0;
        puVar19 = puVar22;
        do {
          uVar4 = uVar4 + 1;
          puVar19 = *(uint **)(puVar19 + 2);
        } while (puVar19 != (uint *)0x0);
      }
      if (uVar4 <= uVar21) break;
      if (uVar21 < pOVar13->_typeArgsArity) {
        TVar7 = AtomicSort::superSort();
      }
      else {
        TVar7._content =
             *(uint64_t *)(pOVar13->_key + (ulong)(uVar21 - pOVar13->_typeArgsArity) * 8 + 8);
      }
      TVar8 = AtomicSort::boolSort();
      puVar19 = puVar22;
      if (TVar7._content == TVar8._content) {
        lVar9 = 0x80;
        uVar4 = uVar24;
        uVar15 = uVar21;
        while (uVar15 != 0) {
          puVar19 = *(uint **)(puVar19 + 2);
          uVar4 = uVar4 + 1;
          uVar15 = uVar4;
        }
      }
      else {
        lVar9 = 0x60;
        uVar4 = uVar24;
        uVar15 = uVar21;
        while (uVar15 != 0) {
          puVar19 = *(uint **)(puVar19 + 2);
          uVar4 = uVar4 + 1;
          uVar15 = uVar4;
        }
      }
      puVar16 = *(ulong **)
                 (*(long *)((long)&(DAT_00b521b0->_dividesNvalues)._capacity + lVar9) +
                 (ulong)*puVar19 * 8);
      std::__cxx11::string::_M_append((char *)&local_180,*puVar16);
      local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_160,*puVar16,puVar16[1] + *puVar16)
      ;
      std::__cxx11::string::append((char *)&local_160);
      if (uVar21 < pOVar13->_typeArgsArity) {
        local_f8 = AtomicSort::superSort();
      }
      else {
        local_f8._content =
             *(uint64_t *)(pOVar13->_key + (ulong)(uVar21 - pOVar13->_typeArgsArity) * 8 + 8);
      }
      TermList::toString_abi_cxx11_(&local_140,&local_f8,false);
      uVar20 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p != &local_160.field_2) {
        uVar20 = local_160.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar20 < local_140._M_string_length + local_160._M_string_length) {
        uVar20 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != &local_140.field_2) {
          uVar20 = local_140.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar20 < local_140._M_string_length + local_160._M_string_length)
        goto LAB_005bca32;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_140,0,(char *)0x0,(ulong)local_160._M_dataplus._M_p);
      }
      else {
LAB_005bca32:
        puVar6 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_160,(ulong)local_140._M_dataplus._M_p);
      }
      local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
      puVar16 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar16) {
        local_1a0.field_2._M_allocated_capacity = *puVar16;
        local_1a0.field_2._8_8_ = puVar6[3];
      }
      else {
        local_1a0.field_2._M_allocated_capacity = *puVar16;
        local_1a0._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_1a0._M_string_length = puVar6[1];
      *puVar6 = puVar16;
      puVar6[1] = 0;
      *(undefined1 *)puVar16 = 0;
      std::__cxx11::string::_M_append((char *)&local_1c0,(ulong)local_1a0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
        operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p != &local_160.field_2) {
        operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
      }
      uVar4 = 0xffffffff;
      for (puVar19 = puVar22; puVar19 != (uint *)0x0; puVar19 = *(uint **)(puVar19 + 2)) {
        uVar4 = uVar4 + 1;
      }
      if (uVar21 != uVar4) {
        std::__cxx11::string::append((char *)&local_180);
        std::__cxx11::string::append((char *)&local_1c0);
      }
      uVar21 = uVar21 + 1;
      uVar24 = uVar24 - 1;
    }
    std::operator+(&local_b8,"$let([",&local_1c0);
    plVar14 = (long *)std::__cxx11::string::append((char *)&local_b8);
    __return_storage_ptr__ = local_120;
    paVar10 = &local_160.field_2;
    plVar18 = plVar14 + 2;
    if ((long *)*plVar14 == plVar18) {
      local_e8 = *plVar18;
      lStack_e0 = plVar14[3];
      local_f8._content = (uint64_t)&local_e8;
    }
    else {
      local_e8 = *plVar18;
      local_f8._content = (uint64_t)*plVar14;
    }
    local_f0 = plVar14[1];
    *plVar14 = (long)plVar18;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    plVar14 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_f8,(ulong)local_180._M_dataplus._M_p);
    puVar16 = (ulong *)(plVar14 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar14 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar16) {
      local_140.field_2._M_allocated_capacity = *puVar16;
      local_140.field_2._8_8_ = plVar14[3];
      local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    }
    else {
      local_140.field_2._M_allocated_capacity = *puVar16;
      local_140._M_dataplus._M_p = (pointer)*plVar14;
    }
    local_140._M_string_length = plVar14[1];
    *plVar14 = (long)puVar16;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_140);
    puVar16 = puVar6 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar16) {
      local_160.field_2._M_allocated_capacity = *puVar16;
      local_160.field_2._8_8_ = puVar6[3];
      local_160._M_dataplus._M_p = (pointer)paVar10;
    }
    else {
      local_160.field_2._M_allocated_capacity = *puVar16;
      local_160._M_dataplus._M_p = (pointer)*puVar6;
    }
    local_160._M_string_length = puVar6[1];
    *puVar6 = puVar16;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    TermList::toString_abi_cxx11_(&local_118,&local_d8,false);
    uVar20 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != paVar10) {
      uVar20 = local_160.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar20 < local_118._M_string_length + local_160._M_string_length) {
      uVar20 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        uVar20 = local_118.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar20 < local_118._M_string_length + local_160._M_string_length)
      goto LAB_005bd483;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_118,0,(char *)0x0,(ulong)local_160._M_dataplus._M_p);
    }
    else {
LAB_005bd483:
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_160,(ulong)local_118._M_dataplus._M_p)
      ;
    }
    puVar16 = puVar6 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar16) {
      local_1a0.field_2._M_allocated_capacity = *puVar16;
      local_1a0.field_2._8_8_ = puVar6[3];
      local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
    }
    else {
      local_1a0.field_2._M_allocated_capacity = *puVar16;
      local_1a0._M_dataplus._M_p = (pointer)*puVar6;
    }
    local_1a0._M_string_length = puVar6[1];
    *puVar6 = puVar16;
    puVar6[1] = 0;
    *(undefined1 *)puVar16 = 0;
    plVar14 = (long *)std::__cxx11::string::append((char *)&local_1a0);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar17 = (size_type *)(plVar14 + 2);
    if ((size_type *)*plVar14 == psVar17) {
      lVar9 = plVar14[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar17;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar9;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar14;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar17;
    }
    __return_storage_ptr__->_M_string_length = plVar14[1];
    *plVar14 = (long)psVar17;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
      operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != paVar10) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    if ((long *)local_f8._content != &local_e8) {
      operator_delete((void *)local_f8._content,local_e8 + 1);
    }
    local_50.field_2._M_allocated_capacity = local_b8.field_2._M_allocated_capacity;
    local_50._M_dataplus._M_p = local_b8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
LAB_005bdcd1:
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    break;
  case 0xfffffffc:
    lVar9 = *(long *)&this[-1]._functor;
    local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
    local_180._M_string_length = 0;
    local_180.field_2._M_allocated_capacity =
         local_180.field_2._M_allocated_capacity & 0xffffffffffffff00;
    uVar25 = (ulong)(*(uint *)(lVar9 + 0xc) & 0xfffffff);
    paVar10 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                **)(lVar9 + 0x28 + uVar25 * 8);
    local_120 = __return_storage_ptr__;
    if (((uint)paVar10 & 3) != 2) {
      do {
        local_1a0._M_dataplus._M_p = (pointer)paVar10;
        TermList::toString_abi_cxx11_(&local_1c0,(TermList *)&local_1a0,false);
        std::__cxx11::string::_M_append((char *)&local_180,(ulong)local_1c0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
          operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
        }
        if ((int)uVar25 != 1) {
          std::__cxx11::string::append((char *)&local_180);
        }
        paVar10 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    **)(lVar9 + 0x20 + uVar25 * 8);
        uVar25 = uVar25 - 1;
      } while (((uint)paVar10 & 3) != 2);
    }
    std::operator+(&local_1c0,"[",&local_180);
    plVar14 = (long *)std::__cxx11::string::append((char *)&local_1c0);
    __return_storage_ptr__ = local_120;
    (local_120->_M_dataplus)._M_p = (pointer)&local_120->field_2;
    psVar17 = (size_type *)(plVar14 + 2);
    if ((size_type *)*plVar14 == psVar17) {
      lVar9 = plVar14[3];
      (local_120->field_2)._M_allocated_capacity = *psVar17;
      *(long *)((long)&local_120->field_2 + 8) = lVar9;
    }
    else {
      (local_120->_M_dataplus)._M_p = (pointer)*plVar14;
      (local_120->field_2)._M_allocated_capacity = *psVar17;
    }
    local_120->_M_string_length = plVar14[1];
    *plVar14 = (long)psVar17;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    uVar20 = local_180.field_2._M_allocated_capacity;
    _Var23._M_p = local_180._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p == &local_180.field_2) {
      return __return_storage_ptr__;
    }
    goto LAB_005bdd09;
  case 0xfffffffd:
    Formula::toString_abi_cxx11_(&local_180,*(Formula **)&this[-1]._functor);
    if ((*(char *)(Lib::env + 0x913a) == '\0') && ((*(byte *)(Lib::env + 0xa532) & 1) == 0)) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,local_180._M_dataplus._M_p,
                 local_180._M_dataplus._M_p + local_180._M_string_length);
    }
    else {
      std::operator+(&local_1c0,"$term{",&local_180);
      plVar14 = (long *)std::__cxx11::string::append((char *)&local_1c0);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar17 = (size_type *)(plVar14 + 2);
      if ((size_type *)*plVar14 == psVar17) {
        lVar9 = plVar14[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar17;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar9;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar14;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar17;
      }
      __return_storage_ptr__->_M_string_length = plVar14[1];
      *plVar14 = (long)psVar17;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
        operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
      }
    }
    goto LAB_005bdcff;
  case 0xfffffffe:
    local_58._content = *(uint64_t *)&this[-1]._maxRedLen;
    if (((local_58._content & 3) == 0) && (bVar3 = isBoolean((Term *)local_58._content), bVar3)) {
      pSVar12 = (DAT_00b521b0->_preds)._stack[(int)this[-1]._functor];
      bVar3 = true;
    }
    else {
      pSVar12 = (Symbol *)Signature::functionName_abi_cxx11_(DAT_00b521b0,this[-1]._functor);
      bVar3 = false;
    }
    local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
    pcVar1 = (pSVar12->_name)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_180,pcVar1,pcVar1 + (pSVar12->_name)._M_string_length);
    if (bVar3) {
      local_120 = __return_storage_ptr__;
      pOVar13 = Signature::Symbol::predType((DAT_00b521b0->_preds)._stack[this[-1]._functor]);
      uVar20 = extraout_RDX_01;
    }
    else {
      local_120 = __return_storage_ptr__;
      pOVar13 = Signature::Symbol::fnType((DAT_00b521b0->_funs)._stack[this[-1]._functor]);
      uVar20 = extraout_RDX_02;
    }
    puVar22 = *(uint **)&this[-1]._weight;
    local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
    local_1c0._M_string_length = 0;
    local_1c0.field_2._M_allocated_capacity =
         local_1c0.field_2._M_allocated_capacity & 0xffffffffffffff00;
    if (puVar22 != (uint *)0x0) {
      uVar21 = 0;
      paVar10 = &local_1a0.field_2;
      uVar24 = 0;
      while( true ) {
        uVar4 = 0;
        puVar19 = puVar22;
        do {
          uVar4 = uVar4 + 1;
          puVar19 = *(uint **)(puVar19 + 2);
        } while (puVar19 != (uint *)0x0);
        puVar19 = puVar22;
        uVar15 = uVar21;
        uVar2 = uVar24;
        if (uVar4 <= uVar24) break;
        while (uVar2 != 0) {
          uVar15 = uVar15 + 1;
          puVar19 = *(uint **)(puVar19 + 2);
          uVar2 = uVar15;
        }
        variableToString_abi_cxx11_(&local_1a0,(Term *)(ulong)*puVar19,(uint)uVar20);
        std::__cxx11::string::_M_append((char *)&local_1c0,(ulong)local_1a0._M_dataplus._M_p);
        uVar20 = extraout_RDX_03;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p != paVar10) {
          operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
          uVar20 = extraout_RDX_04;
        }
        uVar4 = 0xffffffff;
        puVar19 = puVar22;
        do {
          puVar19 = *(uint **)(puVar19 + 2);
          uVar4 = uVar4 + 1;
        } while (puVar19 != (uint *)0x0);
        if (uVar24 < uVar4) {
          std::__cxx11::string::append((char *)&local_1c0);
          uVar20 = extraout_RDX_05;
        }
        uVar24 = uVar24 + 1;
        uVar21 = uVar21 - 1;
      }
      iVar5 = 0;
      do {
        puVar22 = *(uint **)(puVar22 + 2);
        iVar5 = iVar5 + -1;
      } while (puVar22 != (uint *)0x0);
      if (iVar5 != 0) {
        std::operator+(&local_160,"(",&local_1c0);
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_160);
        puVar16 = puVar6 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar16) {
          local_1a0.field_2._M_allocated_capacity = *puVar16;
          local_1a0.field_2._8_8_ = puVar6[3];
          local_1a0._M_dataplus._M_p = (pointer)paVar10;
        }
        else {
          local_1a0.field_2._M_allocated_capacity = *puVar16;
          local_1a0._M_dataplus._M_p = (pointer)*puVar6;
        }
        local_1a0._M_string_length = puVar6[1];
        *puVar6 = puVar16;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_1c0,(string *)&local_1a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p != paVar10) {
          operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_dataplus._M_p != &local_160.field_2) {
          operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
        }
      }
    }
    std::operator+(&local_50,"$let(",&local_180);
    plVar14 = (long *)std::__cxx11::string::append((char *)&local_50);
    __return_storage_ptr__ = local_120;
    puVar16 = (ulong *)(plVar14 + 2);
    if ((ulong *)*plVar14 == puVar16) {
      local_c8 = *puVar16;
      lStack_c0 = plVar14[3];
      local_d8._content = (uint64_t)&local_c8;
    }
    else {
      local_c8 = *puVar16;
      local_d8._content = (uint64_t)*plVar14;
    }
    local_d0 = plVar14[1];
    *plVar14 = (long)puVar16;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    OperatorType::toString_abi_cxx11_(&local_78,pOVar13);
    uVar25 = 0xf;
    if ((ulong *)local_d8._content != &local_c8) {
      uVar25 = local_c8;
    }
    if (uVar25 < local_78._M_string_length + local_d0) {
      uVar20 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        uVar20 = local_78.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar20 < local_78._M_string_length + local_d0) goto LAB_005bd896;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,local_d8._content);
    }
    else {
LAB_005bd896:
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_78._M_dataplus._M_p);
    }
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    puVar16 = puVar6 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar16) {
      local_118.field_2._M_allocated_capacity = *puVar16;
      local_118.field_2._8_8_ = puVar6[3];
    }
    else {
      local_118.field_2._M_allocated_capacity = *puVar16;
      local_118._M_dataplus._M_p = (pointer)*puVar6;
    }
    local_118._M_string_length = puVar6[1];
    *puVar6 = puVar16;
    puVar6[1] = 0;
    *(undefined1 *)puVar16 = 0;
    plVar14 = (long *)std::__cxx11::string::append((char *)&local_118);
    psVar17 = (size_type *)(plVar14 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar14 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar17) {
      local_b8.field_2._M_allocated_capacity = *psVar17;
      local_b8.field_2._8_8_ = plVar14[3];
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    }
    else {
      local_b8.field_2._M_allocated_capacity = *psVar17;
      local_b8._M_dataplus._M_p = (pointer)*plVar14;
    }
    local_b8._M_string_length = plVar14[1];
    *plVar14 = (long)psVar17;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    plVar14 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_b8,(ulong)local_180._M_dataplus._M_p);
    plVar18 = plVar14 + 2;
    if ((long *)*plVar14 == plVar18) {
      local_e8 = *plVar18;
      lStack_e0 = plVar14[3];
      local_f8._content = (uint64_t)&local_e8;
    }
    else {
      local_e8 = *plVar18;
      local_f8._content = (uint64_t)*plVar14;
    }
    local_f0 = plVar14[1];
    *plVar14 = (long)plVar18;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    plVar14 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_f8,(ulong)local_1c0._M_dataplus._M_p);
    puVar16 = (ulong *)(plVar14 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar14 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar16) {
      local_140.field_2._M_allocated_capacity = *puVar16;
      local_140.field_2._8_8_ = plVar14[3];
      local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    }
    else {
      local_140.field_2._M_allocated_capacity = *puVar16;
      local_140._M_dataplus._M_p = (pointer)*plVar14;
    }
    local_140._M_string_length = plVar14[1];
    *plVar14 = (long)puVar16;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_140);
    paVar10 = &local_160.field_2;
    puVar16 = puVar6 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar16) {
      local_160.field_2._M_allocated_capacity = *puVar16;
      local_160.field_2._8_8_ = puVar6[3];
      local_160._M_dataplus._M_p = (pointer)paVar10;
    }
    else {
      local_160.field_2._M_allocated_capacity = *puVar16;
      local_160._M_dataplus._M_p = (pointer)*puVar6;
    }
    local_160._M_string_length = puVar6[1];
    *puVar6 = puVar16;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    TermList::toString_abi_cxx11_(&local_98,&local_58,false);
    uVar20 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != paVar10) {
      uVar20 = local_160.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar20 < local_98._M_string_length + local_160._M_string_length) {
      uVar20 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        uVar20 = local_98.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar20 < local_98._M_string_length + local_160._M_string_length) goto LAB_005bdaf9;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_98,0,(char *)0x0,(ulong)local_160._M_dataplus._M_p);
    }
    else {
LAB_005bdaf9:
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_160,(ulong)local_98._M_dataplus._M_p);
    }
    local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
    puVar16 = puVar6 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar16) {
      local_1a0.field_2._M_allocated_capacity = *puVar16;
      local_1a0.field_2._8_8_ = puVar6[3];
    }
    else {
      local_1a0.field_2._M_allocated_capacity = *puVar16;
      local_1a0._M_dataplus._M_p = (pointer)*puVar6;
    }
    local_1a0._M_string_length = puVar6[1];
    *puVar6 = puVar16;
    puVar6[1] = 0;
    *(undefined1 *)puVar16 = 0;
    plVar14 = (long *)std::__cxx11::string::append((char *)&local_1a0);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar17 = (size_type *)(plVar14 + 2);
    if ((size_type *)*plVar14 == psVar17) {
      lVar9 = plVar14[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar17;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar9;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar14;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar17;
    }
    __return_storage_ptr__->_M_string_length = plVar14[1];
    *plVar14 = (long)psVar17;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
      operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != paVar10) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    if ((long *)local_f8._content != &local_e8) {
      operator_delete((void *)local_f8._content,local_e8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((ulong *)local_d8._content != &local_c8) {
      operator_delete((void *)local_d8._content,local_c8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) goto LAB_005bdcd1;
    break;
  case 0xffffffff:
    Formula::toString_abi_cxx11_(&local_1c0,*(Formula **)&this[-1]._functor);
    puVar6 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_1c0,0,(char *)0x0,0x8fae61);
    local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
    puVar16 = puVar6 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar16) {
      local_180.field_2._M_allocated_capacity = *puVar16;
      local_180.field_2._8_8_ = puVar6[3];
    }
    else {
      local_180.field_2._M_allocated_capacity = *puVar16;
      local_180._M_dataplus._M_p = (pointer)*puVar6;
    }
    local_180._M_string_length = puVar6[1];
    *puVar6 = puVar16;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    plVar14 = (long *)std::__cxx11::string::append((char *)&local_180);
LAB_005bd1e6:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar17 = (size_type *)(plVar14 + 2);
    if ((size_type *)*plVar14 == psVar17) {
      lVar9 = plVar14[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar17;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar9;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar14;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar17;
    }
    __return_storage_ptr__->_M_string_length = plVar14[1];
    *plVar14 = (long)psVar17;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p != &local_180.field_2) {
      operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
    }
    uVar20 = local_1c0.field_2._M_allocated_capacity;
    _Var23._M_p = local_1c0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p == &local_1c0.field_2) {
      return __return_storage_ptr__;
    }
    goto LAB_005bdd09;
  default:
    uVar25 = this->_args[0]._content;
    if ((uVar25 & 0x20) == 0) {
      this_00 = Theory::tuples();
      bVar3 = Theory::Tuples::findProjection
                        (this_00,this->_functor,SUB41(((uint)this->_args[0]._content & 0x10) >> 4,0)
                         ,(uint *)&local_1a0);
      if (bVar3) {
        Lib::Int::toString_abi_cxx11_
                  (&local_1c0,(Int *)((ulong)local_1a0._M_dataplus._M_p & 0xffffffff),i);
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_1c0,0,(char *)0x0,0x8fae84);
        local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
        puVar16 = puVar6 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar16) {
          local_180.field_2._M_allocated_capacity = *puVar16;
          local_180.field_2._8_8_ = puVar6[3];
        }
        else {
          local_180.field_2._M_allocated_capacity = *puVar16;
          local_180._M_dataplus._M_p = (pointer)*puVar6;
        }
        local_180._M_string_length = puVar6[1];
        *puVar6 = puVar16;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        plVar14 = (long *)std::__cxx11::string::append((char *)&local_180);
        goto LAB_005bd1e6;
      }
      uVar25 = this->_args[0]._content;
    }
    paVar10 = &local_180.field_2;
    local_180._M_string_length = 0;
    local_180.field_2._M_allocated_capacity =
         local_180.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_180._M_dataplus._M_p = (pointer)paVar10;
    if ((uVar25 & 0x10) == 0) {
      if ((uVar25 & 0x20) == 0) {
        Signature::functionName_abi_cxx11_(DAT_00b521b0,this->_functor);
        goto LAB_005bc7e6;
      }
      if ((this->_functor == 1 & (*(byte *)(Lib::env + 0xa532) | *(byte *)(Lib::env + 0x913a))) == 1
         ) {
        std::__cxx11::string::_M_replace((ulong)&local_180,0,(char *)0x0,0x8fae8b);
      }
      else {
        std::__cxx11::string::_M_assign((string *)&local_180);
      }
    }
    else {
LAB_005bc7e6:
      std::__cxx11::string::_M_assign((string *)&local_180);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_180._M_dataplus._M_p,
               local_180._M_dataplus._M_p + local_180._M_string_length);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    uVar20 = local_180.field_2._M_allocated_capacity;
    _Var23._M_p = local_180._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p == paVar10) {
      return __return_storage_ptr__;
    }
    goto LAB_005bdd09;
  }
  uVar20 = local_1c0.field_2._M_allocated_capacity;
  _Var23._M_p = local_1c0._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
LAB_005bdced:
    operator_delete(_Var23._M_p,uVar20 + 1);
  }
LAB_005bdcff:
  uVar20 = local_180.field_2._M_allocated_capacity;
  _Var23._M_p = local_180._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p == &local_180.field_2) {
    return __return_storage_ptr__;
  }
LAB_005bdd09:
  operator_delete(_Var23._M_p,uVar20 + 1);
  return __return_storage_ptr__;
}

Assistant:

std::string Term::headToString() const
{
  if (isSpecial()) {
    const Term::SpecialTermData* sd = getSpecialData();

    switch(specialFunctor()) {
      case SpecialFunctor::FORMULA: {
        ASS_EQ(arity(), 0);
        std::string formula = sd->getFormula()->toString();
        return env.options->showFOOL() ? "$term{" + formula + "}" : formula;
      }
      case SpecialFunctor::LET: {
        ASS_EQ(arity(), 1);
        TermList binding = sd->getBinding();
        bool isPredicate = binding.isTerm() && binding.term()->isBoolean();
        std::string functor = isPredicate ? env.signature->predicateName(sd->getFunctor())
                                      : env.signature->functionName(sd->getFunctor());
        OperatorType* type = isPredicate ? env.signature->getPredicate(sd->getFunctor())->predType()
                                         : env.signature->getFunction(sd->getFunctor())->fnType();

        const VList* variables = sd->getVariables();
        std::string variablesList = "";
        for (unsigned i = 0; i < VList::length(variables); i++) {
          unsigned var = VList::nth(variables, i);
          variablesList += Term::variableToString(var);
          if (i < VList::length(variables) - 1) {
            variablesList += ", ";
          }
        }
        if (VList::length(variables)) {
          variablesList = "(" + variablesList + ")";
        }
        return "$let(" + functor + ": " + type->toString() + ", " + functor + variablesList + " := " + binding.toString() + ", ";
      }
      case SpecialFunctor::ITE: {
        ASS_EQ(arity(),2);
        return "$ite(" + sd->getCondition()->toString() + ", ";
      }
      case SpecialFunctor::TUPLE: {
        ASS_EQ(arity(), 0);
        Term* term = sd->getTupleTerm();
        std::string termList = "";
        Term::Iterator tit(term);
        unsigned i = term->arity();
        while (tit.hasNext()) {
          termList += tit.next().toString();
          if (--i > 0) {
            termList += ", ";
          }
        }
        return "[" + termList + "]";
      }
      case SpecialFunctor::LET_TUPLE: {
        ASS_EQ(arity(), 1);
        VList* symbols = sd->getTupleSymbols();
        unsigned tupleFunctor = sd->getFunctor();
        TermList binding = sd->getBinding();

        OperatorType* fnType = env.signature->getFunction(tupleFunctor)->fnType();

        std::string symbolsList = "";
        std::string typesList = "";
        for (unsigned i = 0; i < VList::length(symbols); i++) {
          Signature::Symbol* symbol = (fnType->arg(i) == AtomicSort::boolSort())
            ? env.signature->getPredicate(VList::nth(symbols, i))
            : env.signature->getFunction(VList::nth(symbols, i));
          symbolsList += symbol->name();
          typesList += symbol->name() + ": " + fnType->arg(i).toString();
          if (i != VList::length(symbols) - 1) {
            symbolsList += ", ";
            typesList += ", ";
          }
        }

        return "$let([" + typesList + "], [" + symbolsList + "] := " + binding.toString() + ", ";
      }
      case SpecialFunctor::LAMBDA: {
        VList* vars = sd->getLambdaVars();
        SList* sorts = sd->getLambdaVarSorts();
        TermList lambdaExp = sd->getLambdaExp();

        std::string varList = "[";

        VList::Iterator vs(vars);
        SList::Iterator ss(sorts);
        bool first = true;
        while(vs.hasNext()) {
          if (!first){
            varList += ", ";
          }else{ first = false; }
          varList += Term::variableToString(vs.next()) + " : ";
          varList += ss.next().toString();
        }
        varList += "]";
        return "(^" + varList + " : (" + lambdaExp.toString() + "))";
      }
      case SpecialFunctor::MATCH: {
        // we simply let the arguments be written out
        return "$match(";
      }
      default:
        ASSERTION_VIOLATION;
    }
  } else {
    unsigned proj;
    if (!isSort() && Theory::tuples()->findProjection(functor(), isLiteral(), proj)) {
      return "$proj(" + Int::toString(proj) + ", ";
    }
    bool print = (isLiteral() || isSort() ||
                 (env.signature->getFunction(_functor)->combinator() == Signature::NOT_COMB)) && arity();
    std::string name = "";
    if(isLiteral()) {
      name = static_cast<const Literal *>(this)->predicateName();
    } else if (isSort()) {
      const AtomicSort* asSort = static_cast<const AtomicSort *>(this);
      if(env.options->showFOOL() && asSort->isBoolSort()){
        name = "$bool";
      } else {
        name = asSort->typeConName();
      }
    } else {
      name = functionName();
    }
    return name + (print ? "(" : "");
  }
}